

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplingManager.h
# Opt level: O1

void __thiscall
jaegertracing::testutils::SamplingManager::addSamplingStrategy
          (SamplingManager *this,string *serviceName,Response *response)

{
  int iVar1;
  mapped_type *this_00;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x40));
  if (iVar1 == 0) {
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(this + 8),serviceName);
    jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=(this_00,response);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x40));
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addSamplingStrategy(const std::string& serviceName,
                             const Response& response)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        _sampling[serviceName] = response;
    }